

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void ** __thiscall
TCMallocImplementation::ReadStackTraces(TCMallocImplementation *this,int *sample_period)

{
  int iVar1;
  SpinLock *l;
  ThreadCache *this_00;
  void **ppvVar2;
  ThreadCachePtr TVar3;
  ThreadCachePtr local_68;
  Span *local_58;
  Span *s;
  Span *sampled;
  SpinLockHolder local_38;
  SpinLockHolder h;
  StackTraceTable table;
  int *sample_period_local;
  TCMallocImplementation *this_local;
  
  tcmalloc::StackTraceTable::StackTraceTable((StackTraceTable *)&h);
  l = tcmalloc::Static::pageheap_lock();
  SpinLockHolder::SpinLockHolder(&local_38,l);
  s = tcmalloc::Static::sampled_objects();
  for (local_58 = s->next; local_58 != s; local_58 = local_58->next) {
    tcmalloc::StackTraceTable::AddTrace
              ((StackTraceTable *)&h,(StackTrace *)(local_58->field_4).objects);
  }
  SpinLockHolder::~SpinLockHolder(&local_38);
  TVar3 = tcmalloc::ThreadCachePtr::Grab();
  local_68.ptr_ = TVar3.ptr_;
  local_68.is_emergency_malloc_ = TVar3.is_emergency_malloc_;
  this_00 = tcmalloc::ThreadCachePtr::operator->(&local_68);
  iVar1 = tcmalloc::ThreadCache::GetSamplePeriod(this_00);
  *sample_period = iVar1;
  ppvVar2 = tcmalloc::StackTraceTable::ReadStackTracesAndClear((StackTraceTable *)&h);
  tcmalloc::StackTraceTable::~StackTraceTable((StackTraceTable *)&h);
  return ppvVar2;
}

Assistant:

virtual void** ReadStackTraces(int* sample_period) {
    tcmalloc::StackTraceTable table;
    {
      SpinLockHolder h(Static::pageheap_lock());
      Span* sampled = Static::sampled_objects();
      for (Span* s = sampled->next; s != sampled; s = s->next) {
        table.AddTrace(*reinterpret_cast<StackTrace*>(s->objects));
      }
    }
    *sample_period = ThreadCachePtr::Grab()->GetSamplePeriod();
    return table.ReadStackTracesAndClear(); // grabs and releases pageheap_lock
  }